

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O3

int fB(sunrealtype t,N_Vector c,N_Vector cB,N_Vector cBdot,void *user_data)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double *pdVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  sunrealtype (*acoef) [6];
  long local_c0;
  
  lVar9 = N_VGetArrayPointer();
  lVar10 = N_VGetArrayPointer(cB);
  lVar11 = N_VGetArrayPointer(cBdot);
  uVar6 = *(uint *)((long)user_data + 0x40);
  lVar24 = (long)user_data + 0x328;
  lVar19 = (long)user_data + 0x4e28;
  uVar7 = *(uint *)((long)user_data + 0x44);
  dVar3 = *(double *)((long)user_data + 0x310);
  dVar4 = *(double *)((long)user_data + 0x318);
  uVar25 = (ulong)uVar6;
  lVar1 = (long)(int)uVar7 * 8;
  lVar2 = (long)(int)uVar6 * 8;
  lVar17 = 0;
  lVar34 = 0;
  lVar21 = lVar10;
  lVar27 = lVar9;
  do {
    uVar30 = uVar7;
    if (lVar34 == 0x13) {
      uVar30 = -uVar7;
    }
    uVar28 = -uVar7;
    if (lVar34 == 0) {
      uVar28 = uVar7;
    }
    uVar16 = (ulong)(uVar28 + (int)lVar17);
    uVar31 = (ulong)(uVar30 + (int)lVar17);
    lVar20 = 0;
    lVar15 = lVar27;
    lVar18 = lVar19;
    lVar23 = lVar24;
    lVar33 = lVar17;
    local_c0 = lVar21;
    do {
      if (0 < (int)uVar6) {
        lVar12 = lVar20 * (int)uVar6 + lVar34 * (int)uVar7;
        lVar26 = lVar9 + lVar12 * 8;
        uVar13 = 0;
        do {
          *(double *)(lVar23 + uVar13 * 8) =
               *(double *)((long)user_data + uVar13 * 8 + 0x250) *
               ((double)(int)lVar20 * dVar3 * (double)(int)lVar34 * dVar4 + 1.0);
          uVar13 = uVar13 + 1;
        } while (uVar25 != uVar13);
        uVar13 = 0;
        pdVar22 = (double *)((long)user_data + 0x130);
        do {
          uVar29 = 0;
          pdVar14 = pdVar22;
          do {
            *(double *)(lVar23 + uVar29 * 8) =
                 *pdVar14 * *(double *)(lVar26 + uVar13 * 8) + *(double *)(lVar23 + uVar29 * 8);
            uVar29 = uVar29 + 1;
            pdVar14 = pdVar14 + 6;
          } while (uVar25 != uVar29);
          uVar13 = uVar13 + 1;
          pdVar22 = pdVar22 + 1;
        } while (uVar13 != uVar25);
        uVar13 = 0;
        do {
          dVar5 = *(double *)(lVar23 + uVar13 * 8);
          *(double *)(lVar23 + 0x4b00 + uVar13 * 8) = *(double *)(local_c0 + uVar13 * 8) * dVar5;
          *(double *)(lVar23 + uVar13 * 8) = dVar5 * *(double *)(lVar15 + uVar13 * 8);
          uVar13 = uVar13 + 1;
        } while (uVar25 != uVar13);
        uVar13 = 0;
        pdVar22 = (double *)((long)user_data + 0x130);
        do {
          uVar29 = 0;
          do {
            *(double *)(lVar18 + uVar29 * 8) =
                 pdVar22[uVar29] * *(double *)(lVar26 + uVar13 * 8) *
                 *(double *)(lVar10 + lVar12 * 8 + uVar13 * 8) + *(double *)(lVar18 + uVar29 * 8);
            uVar29 = uVar29 + 1;
          } while (uVar25 != uVar29);
          uVar13 = uVar13 + 1;
          pdVar22 = pdVar22 + 6;
        } while (uVar13 != uVar25);
        uVar30 = uVar6;
        if (lVar20 == 0x13) {
          uVar30 = -uVar6;
        }
        uVar28 = -uVar6;
        if (lVar20 == 0) {
          uVar28 = uVar6;
        }
        if (0 < (int)uVar6) {
          iVar32 = (int)lVar33;
          lVar26 = 0;
          do {
            iVar8 = (int)lVar26;
            lVar12 = (long)(iVar32 + iVar8);
            dVar5 = *(double *)(lVar10 + lVar12 * 8);
            *(double *)(lVar11 + lVar12 * 8) =
                 (-*(double *)((long)user_data + lVar26 * 8 + 0x2e0) *
                  ((*(double *)(lVar10 + (long)(iVar8 + (int)uVar31) * 8) - dVar5) -
                  (dVar5 - *(double *)(lVar10 + (long)((int)uVar16 + iVar8) * 8))) -
                 ((*(double *)(lVar10 + (long)(int)(uVar30 + iVar32 + iVar8) * 8) - dVar5) -
                 (dVar5 - *(double *)(lVar10 + (long)(int)(uVar28 + iVar32 + iVar8) * 8))) *
                 *(double *)((long)user_data + lVar26 * 8 + 0x2b0)) -
                 *(double *)((long)user_data + lVar12 * 8 + 0x4e28);
            lVar26 = lVar26 + 1;
          } while ((ulong)(uVar6 + 1) - 1 != lVar26);
        }
      }
      lVar20 = lVar20 + 1;
      lVar23 = lVar23 + lVar2;
      lVar15 = lVar15 + lVar2;
      local_c0 = local_c0 + lVar2;
      lVar18 = lVar18 + lVar2;
      lVar33 = lVar33 + uVar25;
      uVar16 = uVar16 + uVar25;
      uVar31 = uVar31 + uVar25;
    } while (lVar20 != 0x14);
    lVar34 = lVar34 + 1;
    lVar24 = lVar24 + lVar1;
    lVar27 = lVar27 + lVar1;
    lVar21 = lVar21 + lVar1;
    lVar19 = lVar19 + lVar1;
    lVar17 = lVar17 + (ulong)uVar7;
  } while (lVar34 != 0x14);
  return 0;
}

Assistant:

static int fB(sunrealtype t, N_Vector c, N_Vector cB, N_Vector cBdot,
              void* user_data)
{
  int i, ic, ici, idxl, idxu, idyl, idyu, iyoff, jx, jy, ns, mxns;
  sunrealtype dcxli, dcxui, dcyli, dcyui, x, y, *cox, *coy, *fsave, *fBsave, dx,
    dy;
  sunrealtype *cdata, *cBdata, *cBdotdata;
  WebData wdata;

  wdata     = (WebData)user_data;
  cdata     = N_VGetArrayPointer(c);
  cBdata    = N_VGetArrayPointer(cB);
  cBdotdata = N_VGetArrayPointer(cBdot);

  mxns   = wdata->mxns;
  ns     = wdata->ns;
  fsave  = wdata->fsave;
  fBsave = wdata->fBsave;
  cox    = wdata->cox;
  coy    = wdata->coy;
  mxns   = wdata->mxns;
  dx     = wdata->dx;
  dy     = wdata->dy;

  for (jy = 0; jy < MY; jy++)
  {
    y     = jy * dy;
    iyoff = mxns * jy;
    idyu  = (jy == MY - 1) ? -mxns : mxns;
    idyl  = (jy == 0) ? -mxns : mxns;
    for (jx = 0; jx < MX; jx++)
    {
      x  = jx * dx;
      ic = iyoff + ns * jx;
      /* Get interaction rates at one point (x,y). */
      WebRatesB(x, y, t, cdata + ic, cBdata + ic, fsave + ic, fBsave + ic, wdata);
      idxu = (jx == MX - 1) ? -ns : ns;
      idxl = (jx == 0) ? -ns : ns;
      for (i = 1; i <= ns; i++)
      {
        ici = ic + i - 1;
        /* Do differencing in y. */
        dcyli = cBdata[ici] - cBdata[ici - idyl];
        dcyui = cBdata[ici + idyu] - cBdata[ici];
        /* Do differencing in x. */
        dcxli = cBdata[ici] - cBdata[ici - idxl];
        dcxui = cBdata[ici + idxu] - cBdata[ici];
        /* Collect terms and load cdot elements. */
        cBdotdata[ici] = -coy[i - 1] * (dcyui - dcyli) -
                         cox[i - 1] * (dcxui - dcxli) - fBsave[ici];
      }
    }
  }

  return (0);
}